

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_file_put_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  long iValue;
  char *local_a0;
  jx9_value *local_90;
  jx9_int64 n;
  int nLen;
  int iFlags;
  void *pHandle;
  char *pcStack_48;
  int iOpenFlags;
  char *zData;
  char *zFile;
  jx9_io_stream *pStream;
  jx9_value **ppjStack_28;
  int use_include;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream._4_4_ = 0;
  ppjStack_28 = apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 2) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a file path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    zData = jx9_value_to_string(*ppjStack_28,(int *)&n);
    zFile = (char *)jx9VmGetStreamDevice(pjStack_18->pVm,&zData,(int)n);
    if ((jx9_io_stream *)zFile == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      pcStack_48 = jx9_value_to_string(ppjStack_28[1],(int *)&n);
      if ((int)n < 1) {
        jx9_result_bool(pjStack_18,0);
      }
      else {
        pHandle._4_4_ = 0x1c;
        n._4_4_ = 0;
        if (2 < apArg_local._4_4_) {
          n._4_4_ = jx9_value_to_int(ppjStack_28[2]);
          if ((n._4_4_ & 1) != 0) {
            pStream._4_4_ = 1;
          }
          if ((n._4_4_ & 8) != 0) {
            pHandle._4_4_ = pHandle._4_4_ & 0xffffffef | 0x20;
          }
        }
        if (apArg_local._4_4_ < 4) {
          local_90 = (jx9_value *)0x0;
        }
        else {
          local_90 = ppjStack_28[3];
        }
        _nLen = jx9StreamOpenHandle(pjStack_18->pVm,(jx9_io_stream *)zFile,zData,pHandle._4_4_,
                                    pStream._4_4_,local_90,0,(int *)0x0);
        if (_nLen == (void *)0x0) {
          jx9_context_throw_error_format(pjStack_18,1,"IO error while opening \'%s\'",zData);
          jx9_result_bool(pjStack_18,0);
        }
        else {
          if (*(long *)(zFile + 0x40) == 0) {
            if (zFile == (char *)0x0) {
              local_a0 = "null_stream";
            }
            else {
              local_a0 = *(char **)zFile;
            }
            jx9_context_throw_error_format
                      (pjStack_18,1,"Read-only stream(%s): Cannot perform write operation",local_a0)
            ;
            jx9_result_bool(pjStack_18,0);
          }
          else {
            if (((n._4_4_ & 1) != 0) && (*(long *)(zFile + 0x50) != 0)) {
              (**(code **)(zFile + 0x50))(_nLen,1);
            }
            iValue = (**(code **)(zFile + 0x40))(_nLen,pcStack_48,(long)(int)n);
            if (iValue < 1) {
              jx9_result_bool(pjStack_18,0);
            }
            else {
              jx9_result_int64(pjStack_18,iValue);
            }
          }
          jx9StreamCloseHandle((jx9_io_stream *)zFile,_nLen);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_file_put_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int use_include  = FALSE;
	const jx9_io_stream *pStream;
	const char *zFile;
	const char *zData;
	int iOpenFlags;
	void *pHandle;
	int iFlags;
	int nLen;
	
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Data to write */
	zData = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Nothing to write, return immediately */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-write mode */
	iOpenFlags = JX9_IO_OPEN_CREATE|JX9_IO_OPEN_RDWR|JX9_IO_OPEN_TRUNC;
	/* Extract the flags */
	iFlags = 0;
	if( nArg > 2 ){
		iFlags = jx9_value_to_int(apArg[2]);
		if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/){
			use_include = TRUE;
		}
		if( iFlags & 0x08 /* FILE_APPEND */){
			/* If the file already exists, append the data to the file
			 * instead of overwriting it.
			 */
			iOpenFlags &= ~JX9_IO_OPEN_TRUNC;
			/* Append mode */
			iOpenFlags |= JX9_IO_OPEN_APPEND;
		}
	}
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, iOpenFlags, use_include, 
		nArg > 3 ? apArg[3] : 0, FALSE, FALSE);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xWrite ){
		jx9_int64 n;
		if( (iFlags & 0x01/* LOCK_EX */) && pStream->xLock ){
			/* Try to acquire an exclusive lock */
			pStream->xLock(pHandle, 1/* LOCK_EX */);
		}
		/* Perform the write operation */
		n = pStream->xWrite(pHandle, (const void *)zData, nLen);
		if( n < 1 ){
			/* IO error, return FALSE */
			jx9_result_bool(pCtx, 0);
		}else{
			/* Total number of bytes written */
			jx9_result_int64(pCtx, n);
		}
	}else{
		/* Read-only stream */
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, 
			"Read-only stream(%s): Cannot perform write operation", 
			pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
	}
	/* Close the handle */
	jx9StreamCloseHandle(pStream, pHandle);
	return JX9_OK;
}